

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

char * read_setting_s(settings_r *handle,char *key)

{
  void *pvVar1;
  skeyval *kv;
  skeyval tmp;
  char *val;
  char *key_local;
  settings_r *handle_local;
  
  kv = (skeyval *)key;
  if ((handle == (settings_r *)0x0) ||
     (pvVar1 = find234(handle->t,&kv,(cmpfn234)0x0), pvVar1 == (void *)0x0)) {
    tmp.value = get_setting(key);
  }
  else {
    tmp.value = *(char **)((long)pvVar1 + 8);
    if (tmp.value == (char *)0x0) {
      __assert_fail("val != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/storage.c"
                    ,0x1aa,"char *read_setting_s(settings_r *, const char *)");
    }
  }
  if (tmp.value == (char *)0x0) {
    handle_local = (settings_r *)0x0;
  }
  else {
    handle_local = (settings_r *)dupstr(tmp.value);
  }
  return (char *)handle_local;
}

Assistant:

char *read_setting_s(settings_r *handle, const char *key)
{
    const char *val;
    struct skeyval tmp, *kv;

    tmp.key = key;
    if (handle != NULL &&
        (kv = find234(handle->t, &tmp, NULL)) != NULL) {
        val = kv->value;
        assert(val != NULL);
    } else
        val = get_setting(key);

    if (!val)
        return NULL;
    else
        return dupstr(val);
}